

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::UnsafeShallowSwapFields
          (Reflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_38;
  Arena *local_28;
  
  local_38.super_LogMessage._0_8_ = (message1->super_MessageLite)._internal_metadata_.ptr_;
  if ((local_38.super_LogMessage._0_8_ & 1) != 0) {
    local_38.super_LogMessage._0_8_ =
         *(ulong *)(local_38.super_LogMessage._0_8_ & 0xfffffffffffffffe);
  }
  local_28 = (Arena *)(message2->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)local_28 & 1) != 0) {
    local_28 = *(Arena **)((ulong)local_28 & 0xfffffffffffffffe);
  }
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                          ((Arena **)&local_38,&local_28,
                           "message1->GetArena() == message2->GetArena()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    SwapFieldsImpl<true>(this,message1,message2,fields);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0x4dd,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
}

Assistant:

void Reflection::UnsafeShallowSwapFields(
    Message* message1, Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  ABSL_DCHECK_EQ(message1->GetArena(), message2->GetArena());

  SwapFieldsImpl<true>(message1, message2, fields);
}